

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walltime.cc
# Opt level: O0

string * __thiscall
benchmark::(anonymous_namespace)::DateTimeString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,bool local)

{
  allocator local_12a;
  byte local_129;
  CheckHandler local_128;
  undefined1 local_120 [8];
  tm timeinfo_1;
  tm timeinfo;
  size_t written;
  char storage [128];
  time_t local_20;
  time_t now;
  string *psStack_10;
  bool local_local;
  
  now._7_1_ = (byte)this & 1;
  psStack_10 = __return_storage_ptr__;
  storage._120_8_ = std::chrono::_V2::system_clock::now();
  local_20 = std::chrono::_V2::system_clock::to_time_t((time_point *)(storage + 0x78));
  if ((now._7_1_ & 1) == 0) {
    memset(local_120,0,0x38);
    gmtime_r(&local_20,(tm *)local_120);
    timeinfo.tm_zone = (char *)strftime((char *)&written,0x80,"%F %T",(tm *)local_120);
  }
  else {
    memset(&timeinfo_1.tm_zone,0,0x38);
    localtime_r(&local_20,(tm *)&timeinfo_1.tm_zone);
    timeinfo.tm_zone = (char *)strftime((char *)&written,0x80,"%F %T",(tm *)&timeinfo_1.tm_zone);
  }
  local_129 = 0;
  if (timeinfo.tm_zone < (char *)0x80) {
    internal::GetNullLogInstance();
  }
  else {
    internal::CheckHandler::CheckHandler
              (&local_128,"written < arraysize(storage)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/tests/external/benchmark/src/walltime.cc"
               ,"DateTimeString",0xfc);
    local_129 = 1;
    internal::CheckHandler::GetLog(&local_128);
  }
  if ((local_129 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)&written,&local_12a);
    std::allocator<char>::~allocator((allocator<char> *)&local_12a);
    return __return_storage_ptr__;
  }
  internal::CheckHandler::~CheckHandler(&local_128);
}

Assistant:

std::string DateTimeString(bool local) {
  typedef std::chrono::system_clock Clock;
  std::time_t now = Clock::to_time_t(Clock::now());
  char storage[128];
  std::size_t written;

  if (local) {
#if defined(BENCHMARK_OS_WINDOWS)
    written = std::strftime(storage, sizeof(storage), "%x %X", ::localtime(&now));
#else
    std::tm timeinfo;
    std::memset(&timeinfo, 0, sizeof(std::tm));
    ::localtime_r(&now, &timeinfo);
    written = std::strftime(storage, sizeof(storage), "%F %T", &timeinfo);
#endif
  } else {
#if defined(BENCHMARK_OS_WINDOWS)
    written = std::strftime(storage, sizeof(storage), "%x %X", ::gmtime(&now));
#else
    std::tm timeinfo;
    std::memset(&timeinfo, 0, sizeof(std::tm));
    ::gmtime_r(&now, &timeinfo);
    written = std::strftime(storage, sizeof(storage), "%F %T", &timeinfo);
#endif
  }
  CHECK(written < arraysize(storage));
  ((void)written); // prevent unused variable in optimized mode.
  return std::string(storage);
}